

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O2

void __thiscall duckdb::DataChunk::Slice(DataChunk *this,SelectionVector *sel_vector,idx_t count_p)

{
  reference this_00;
  idx_t c;
  ulong __n;
  SelCache merge_cache;
  
  this->count = count_p;
  merge_cache.cache._M_h._M_buckets = &merge_cache.cache._M_h._M_single_bucket;
  merge_cache.cache._M_h._M_bucket_count = 1;
  merge_cache.cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  merge_cache.cache._M_h._M_element_count = 0;
  merge_cache.cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  merge_cache.cache._M_h._M_rehash_policy._M_next_resize = 0;
  merge_cache.cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (__n = 0; __n < (ulong)(((long)(this->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    this_00 = vector<duckdb::Vector,_true>::get<true>(&this->data,__n);
    Vector::Slice(this_00,sel_vector,count_p,&merge_cache);
  }
  ::std::
  _Hashtable<unsigned_int_*,_std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_std::allocator<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int_*>,_std::hash<unsigned_int_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int_*,_std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_std::allocator<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int_*>,_std::hash<unsigned_int_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&merge_cache);
  return;
}

Assistant:

void DataChunk::Slice(const SelectionVector &sel_vector, idx_t count_p) {
	this->count = count_p;
	SelCache merge_cache;
	for (idx_t c = 0; c < ColumnCount(); c++) {
		data[c].Slice(sel_vector, count_p, merge_cache);
	}
}